

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_> *
__thiscall
kj::_::NullableValue<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>::
operator=(NullableValue<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>
          *this,NullableValue<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>
                *other)

{
  SegmentReader *pSVar1;
  CapTableReader *pCVar2;
  void *pvVar3;
  WirePointer *pWVar4;
  ResponseHook *pRVar5;
  StructPointerCount SVar6;
  undefined2 uVar7;
  int iVar8;
  undefined4 uVar9;
  
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      Own<capnp::ResponseHook,_std::nullptr_t>::dispose(&(this->field_1).value.hook);
    }
    if (other->isSet == true) {
      pSVar1 = (other->field_1).value.super_Reader._reader.segment;
      pCVar2 = (other->field_1).value.super_Reader._reader.capTable;
      pvVar3 = (other->field_1).value.super_Reader._reader.data;
      pWVar4 = (other->field_1).value.super_Reader._reader.pointers;
      SVar6 = *(StructPointerCount *)((long)&other->field_1 + 0x24);
      uVar7 = *(undefined2 *)((long)&other->field_1 + 0x26);
      iVar8 = *(int *)((long)&other->field_1 + 0x28);
      uVar9 = *(undefined4 *)((long)&other->field_1 + 0x2c);
      *(StructDataBitCount *)((long)&this->field_1 + 0x20) =
           *(StructDataBitCount *)((long)&other->field_1 + 0x20);
      *(StructPointerCount *)((long)&this->field_1 + 0x24) = SVar6;
      *(undefined2 *)((long)&this->field_1 + 0x26) = uVar7;
      *(int *)((long)&this->field_1 + 0x28) = iVar8;
      *(undefined4 *)((long)&this->field_1 + 0x2c) = uVar9;
      (this->field_1).value.super_Reader._reader.data = pvVar3;
      (this->field_1).value.super_Reader._reader.pointers = pWVar4;
      (this->field_1).value.super_Reader._reader.segment = pSVar1;
      (this->field_1).value.super_Reader._reader.capTable = pCVar2;
      pRVar5 = (other->field_1).value.hook.ptr;
      (this->field_1).value.hook.disposer = (other->field_1).value.hook.disposer;
      (this->field_1).value.hook.ptr = pRVar5;
      (other->field_1).value.hook.ptr = (ResponseHook *)0x0;
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }